

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<duckdb_libpgquery::PGSetOperation>
          (NotImplementedException *this,string *msg,PGSetOperation params)

{
  string local_30;
  
  Exception::ConstructMessage<duckdb_libpgquery::PGSetOperation>(&local_30,msg,params);
  NotImplementedException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}